

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  uint uVar1;
  sqlite3 *db;
  char *zName;
  char *pKey;
  sqlite3 *db_00;
  int iVar2;
  HashElem *pHVar3;
  uint iDb;
  uint uVar4;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    iVar2 = sqlite3ReadSchema(pParse);
    if (iVar2 == 0) {
      zName = pName->a[0].u4.zDatabase;
      uVar1 = db->nDb;
      if (0 < (int)uVar1) {
        pKey = pName->a[0].zName;
        db_00 = (sqlite3 *)db->aDb;
        uVar4 = 0;
        do {
          iDb = uVar4 < 2 ^ uVar4;
          if (zName == (char *)0x0) {
LAB_001750c4:
            pHVar3 = findElementWithHash((Hash *)(*(long *)(db_00->aLimit + (ulong)iDb * 8 + -0x1c)
                                                 + 0x38),pKey,(uint *)0x0);
            if ((Trigger *)pHVar3->data != (Trigger *)0x0) {
              sqlite3DropTriggerPtr(pParse,(Trigger *)pHVar3->data);
              goto LAB_00175144;
            }
          }
          else {
            iVar2 = sqlite3DbIsNamed(db_00,iDb,zName);
            if (iVar2 != 0) goto LAB_001750c4;
          }
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      if (noErr == 0) {
        sqlite3ErrorMsg(pParse,"no such trigger: %S",pName->a);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,zName);
      }
      pParse->checkSchema = '\x01';
    }
  }
LAB_00175144:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  assert( pName->a[0].fg.fixedSchema==0 && pName->a[0].fg.isSubquery==0 );
  zDb = pName->a[0].u4.zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName->a);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}